

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-job.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  string *psVar3;
  ostream *poVar4;
  allocator<char> local_13d;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  QPDFJob j_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130 [3];
  QPDFJob j;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  string *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  string *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  char *new_argv [11];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  pcVar2 = (char *)QUtil::getWhoami(*argv);
  if (argc == 1) {
    QPDFJob::QPDFJob(&j);
    QPDFJob::config();
    std::__cxx11::string::string<std::allocator<char>>((string *)new_argv,"in.pdf",&local_139);
    psVar3 = (string *)QPDFJob::Config::inputFile(local_108);
    std::__cxx11::string::string<std::allocator<char>>((string *)&j_1,"out1.pdf",&local_13a);
    QPDFJob::Config::outputFile(psVar3);
    QPDFJob::Config::pages();
    std::__cxx11::string::string<std::allocator<char>>(local_90,".",&local_13b);
    psVar3 = (string *)QPDFJob::PagesConfig::file(local_f8);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"1",&local_13c);
    QPDFJob::PagesConfig::range(psVar3);
    QPDFJob::PagesConfig::endPages();
    QPDFJob::Config::linearize();
    psVar3 = (string *)QPDFJob::Config::staticId();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"n",&local_13d);
    QPDFJob::Config::compressStreams(psVar3);
    QPDFJob::Config::checkConfiguration();
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
    std::__cxx11::string::~string((string *)&j_1);
    std::__cxx11::string::~string((string *)new_argv);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    QPDFJob::run();
    poVar4 = std::operator<<((ostream *)&std::cout,"out1 status: ");
    iVar1 = QPDFJob::getExitCode();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
    new_argv[1] = "in.pdf";
    new_argv[2] = "out2.pdf";
    new_argv[3] = "--linearize";
    new_argv[4] = "--pages";
    new_argv[5] = ".";
    new_argv[6] = "1";
    new_argv[7] = "--";
    new_argv[8] = "--static-id";
    new_argv[9] = "--compress-streams=n";
    new_argv[10] = (char *)0x0;
    new_argv[0] = pcVar2;
    QPDFJob::QPDFJob(&j_1);
    QPDFJob::initializeFromArgv((char **)&j_1,(char *)new_argv);
    QPDFJob::run();
    poVar4 = std::operator<<((ostream *)&std::cout,"out2 status: ");
    iVar1 = QPDFJob::getExitCode();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_130);
    QPDFJob::QPDFJob(&j_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)new_argv,
               "{\n  \"inputFile\": \"in.pdf\",\n  \"outputFile\": \"out3.pdf\",\n  \"staticId\": \"\",\n  \"linearize\": \"\",\n  \"compressStreams\": \"n\",\n  \"pages\": [\n    {\n      \"file\": \".\",\n      \"range\": \"1\"\n    }\n  ]\n}\n"
               ,(allocator<char> *)local_90);
    QPDFJob::initializeFromJson((string *)&j_1,SUB81(new_argv,0));
    std::__cxx11::string::~string((string *)new_argv);
    QPDFJob::run();
    poVar4 = std::operator<<((ostream *)&std::cout,"out3 status: ");
    iVar1 = QPDFJob::getExitCode();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_130);
    return 0;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar4 = std::operator<<(poVar4,pcVar2);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,
                           "This program linearizes the first page of in.pdf to out1.pdf, out2.pdf, and"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,
                           " out3.pdf, each demonstrating a different way to use the QPDFJob API");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 1) {
        usage();
    }

    // The examples below all catch std::exception. Note that QPDFUsage can be caught separately to
    // report on errors in using the API itself. For CLI, this is command-line usage. For JSON or
    // the API, it would be errors from the equivalent invocation.

    // Note that staticId is used for testing only.

    try {
        // Use the config API
        QPDFJob j;
        j.config()
            ->inputFile("in.pdf")
            ->outputFile("out1.pdf")
            ->pages()
            // Prior to qpdf 11.9.0, call ->pageSpec(file, range, password)
            ->file(".")
            ->range("1")
            ->endPages()
            ->linearize()
            ->staticId()           // for testing only
            ->compressStreams("n") // avoid dependency on zlib output
            ->checkConfiguration();
        j.run();
        std::cout << "out1 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        char const* new_argv[] = {
            whoami,
            "in.pdf",
            "out2.pdf",
            "--linearize",
            "--pages",
            ".",
            "1",
            "--",
            "--static-id",
            "--compress-streams=n", // avoid dependency on zlib output
            nullptr};
        QPDFJob j;
        j.initializeFromArgv(new_argv);
        j.run();
        std::cout << "out2 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        // Use the JSON API
        QPDFJob j;
        j.initializeFromJson(R"({
  "inputFile": "in.pdf",
  "outputFile": "out3.pdf",
  "staticId": "",
  "linearize": "",
  "compressStreams": "n",
  "pages": [
    {
      "file": ".",
      "range": "1"
    }
  ]
}
)");
        j.run();
        std::cout << "out3 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    return 0;
}